

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_early_data_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint16_t uVar1;
  size_t sVar2;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((contents != (CBS *)0x0) && (uVar1 = ssl_protocol_version(hs->ssl), 0x303 < uVar1)) {
    sVar2 = CBS_len(contents);
    if (sVar2 != 0) {
      *out_alert = '2';
      return false;
    }
    *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffff7ff | 0x800;
    return true;
  }
  return true;
}

Assistant:

static bool ext_early_data_parse_clienthello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL || ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  hs->early_data_offered = true;
  return true;
}